

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O2

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,NewVariableExpression *expression)

{
  VariableValue *this_00;
  PrimitiveSimpleObject *this_01;
  Type *this_02;
  string local_50;
  
  this_00 = (VariableValue *)operator_new(0x50);
  this_01 = (PrimitiveSimpleObject *)operator_new(0x18);
  this_02 = (Type *)operator_new(0x28);
  std::__cxx11::string::string
            ((string *)&local_50,(string *)&expression->variable_type_->type_name_);
  Type::Type(this_02,&local_50);
  PrimitiveSimpleObject::PrimitiveSimpleObject(this_01,this_02);
  VariableValue::VariableValue(this_00,this_01);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)this_00;
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(NewVariableExpression* expression) {
  tos_value_ = new VariableValue(new PrimitiveSimpleObject(
      new Type(expression->variable_type_->type_name_)));
}